

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_16_pixels(__m256i *s0,__m256i *s1,__m256i *x)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [32];
  undefined1 (*in_RDX) [32];
  __m256i pp [8];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [16];
  __m256i *in_stack_ffffffffffffff30;
  __m256i *in_stack_ffffffffffffff38;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  pack_pixels(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  pack_pixels(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  auVar1._16_8_ = in_stack_ffffffffffffff30;
  auVar1._0_16_ = local_e0;
  auVar1._24_8_ = in_stack_ffffffffffffff38;
  auVar1 = vperm2i128_avx2(local_160,auVar1,0x20);
  *in_RDX = auVar1;
  auVar1 = vperm2i128_avx2(local_140,local_c0,0x20);
  in_RDX[1] = auVar1;
  auVar1 = vperm2i128_avx2(local_120,local_a0,0x20);
  in_RDX[2] = auVar1;
  auVar1 = vperm2i128_avx2(local_100,local_80,0x20);
  in_RDX[3] = auVar1;
  uVar2 = *(undefined8 *)(in_RDX[2] + 8);
  uVar3 = *(undefined8 *)(in_RDX[2] + 0x10);
  uVar4 = *(undefined8 *)(in_RDX[2] + 0x18);
  *(undefined8 *)in_RDX[4] = *(undefined8 *)in_RDX[2];
  *(undefined8 *)(in_RDX[4] + 8) = uVar2;
  *(undefined8 *)(in_RDX[4] + 0x10) = uVar3;
  *(undefined8 *)(in_RDX[4] + 0x18) = uVar4;
  uVar2 = *(undefined8 *)(in_RDX[3] + 8);
  uVar3 = *(undefined8 *)(in_RDX[3] + 0x10);
  uVar4 = *(undefined8 *)(in_RDX[3] + 0x18);
  *(undefined8 *)in_RDX[5] = *(undefined8 *)in_RDX[3];
  *(undefined8 *)(in_RDX[5] + 8) = uVar2;
  *(undefined8 *)(in_RDX[5] + 0x10) = uVar3;
  *(undefined8 *)(in_RDX[5] + 0x18) = uVar4;
  auVar5._16_8_ = in_stack_ffffffffffffff30;
  auVar5._0_16_ = local_e0;
  auVar5._24_8_ = in_stack_ffffffffffffff38;
  auVar1 = vperm2i128_avx2(local_160,auVar5,0x31);
  in_RDX[6] = auVar1;
  auVar1 = vperm2i128_avx2(local_140,local_c0,0x31);
  in_RDX[7] = auVar1;
  return;
}

Assistant:

static inline void pack_16_pixels(const __m256i *s0, const __m256i *s1,
                                  __m256i *x /*x[8]*/) {
  __m256i pp[8];
  pack_pixels(s0, pp);
  pack_pixels(s1, &pp[4]);
  x[0] = _mm256_permute2x128_si256(pp[0], pp[4], 0x20);
  x[1] = _mm256_permute2x128_si256(pp[1], pp[5], 0x20);
  x[2] = _mm256_permute2x128_si256(pp[2], pp[6], 0x20);
  x[3] = _mm256_permute2x128_si256(pp[3], pp[7], 0x20);
  x[4] = x[2];
  x[5] = x[3];
  x[6] = _mm256_permute2x128_si256(pp[0], pp[4], 0x31);
  x[7] = _mm256_permute2x128_si256(pp[1], pp[5], 0x31);
}